

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextBox.cpp
# Opt level: O0

void __thiscall gui::TextBox::setWidthCharacters(TextBox *this,size_t widthCharacters)

{
  float fVar1;
  uint uVar2;
  element_type *peVar3;
  String *in_RSI;
  TextBox *in_RDI;
  float X;
  FloatRect FVar4;
  FloatRect bounds;
  string textBounds;
  Text *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  float fVar5;
  locale *locale;
  string *ansiString;
  allocator *caretPosition;
  Vector2f local_88;
  undefined8 local_80;
  undefined8 local_78;
  string local_70;
  allocator local_31;
  string local_30 [48];
  
  if ((String *)in_RDI->widthCharacters_ != in_RSI) {
    in_RDI->widthCharacters_ = (size_t)in_RSI;
    caretPosition = &local_31;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,(ulong)in_RSI,'A',caretPosition);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    peVar3 = std::__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1d9189);
    locale = (locale *)&peVar3->text_;
    ansiString = &local_70;
    std::locale::locale((locale *)ansiString);
    sf::String::String(in_RSI,ansiString,locale);
    sf::Text::setString((Text *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                        (String *)in_stack_ffffffffffffff08);
    sf::String::~String((String *)0x1d91e3);
    std::locale::~locale((locale *)&local_70);
    std::__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1d9201);
    FVar4 = sf::Text::getLocalBounds(in_stack_ffffffffffffff08);
    local_78 = FVar4._8_8_;
    local_80 = FVar4._0_8_;
    peVar3 = std::__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1d924b);
    fVar5 = (peVar3->textPadding_).x;
    X = fVar5 + fVar5 + (float)local_80 + (float)local_78;
    peVar3 = std::__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1d927e);
    fVar5 = (peVar3->textPadding_).y;
    peVar3 = std::__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1d9296);
    fVar1 = (peVar3->textPadding_).z;
    std::__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1d92ae);
    uVar2 = TextBoxStyle::getCharacterSize((TextBoxStyle *)0x1d92b6);
    sf::Vector2<float>::Vector2(&local_88,X,fVar5 + fVar5 + fVar1 * (float)uVar2);
    in_RDI->size_ = local_88;
    updateCaretPosition(in_RDI,(size_t)caretPosition);
    std::__cxx11::string::~string(local_30);
  }
  return;
}

Assistant:

void TextBox::setWidthCharacters(size_t widthCharacters) {
    if (widthCharacters_ == widthCharacters) {
        return;
    }
    widthCharacters_ = widthCharacters;

    std::string textBounds(widthCharacters, 'A');
    style_->text_.setString(textBounds);

    const auto bounds = style_->text_.getLocalBounds();
    size_ = sf::Vector2f(
        2.0f * style_->textPadding_.x + bounds.left + bounds.width,
        2.0f * style_->textPadding_.y + style_->textPadding_.z * style_->getCharacterSize()
    );

    updateCaretPosition(0);
}